

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMatrixSlice.h
# Opt level: O0

iterator * __thiscall
HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::operator++(iterator *this)

{
  reference pvVar1;
  int iVar2;
  iterator *in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  HighsInt offset;
  undefined4 in_stack_fffffffffffffff0;
  
  iVar2 = -in_RDI->currentNode;
  if (in_RDI->nodeLeft[in_RDI->currentNode] == -1) {
    if (in_RDI->nodeRight[in_RDI->currentNode] == -1) {
      pvVar1 = std::vector<int,_std::allocator<int>_>::back
                         ((vector<int,_std::allocator<int>_> *)
                          CONCAT44(iVar2,in_stack_fffffffffffffff0));
      in_RDI->currentNode = *pvVar1;
      std::vector<int,_std::allocator<int>_>::pop_back
                ((vector<int,_std::allocator<int>_> *)0x7236d3);
    }
    else {
      in_RDI->currentNode = in_RDI->nodeRight[in_RDI->currentNode];
    }
  }
  else {
    if (in_RDI->nodeRight[in_RDI->currentNode] != -1) {
      std::vector<int,_std::allocator<int>_>::push_back
                (unaff_retaddr,(value_type_conflict2 *)in_RDI);
    }
    in_RDI->currentNode = in_RDI->nodeLeft[in_RDI->currentNode];
  }
  iVar2 = in_RDI->currentNode + iVar2;
  (in_RDI->pos_).index_ = (in_RDI->pos_).index_ + iVar2;
  (in_RDI->pos_).value_ = (in_RDI->pos_).value_ + iVar2;
  return in_RDI;
}

Assistant:

iterator& operator++() {
      HighsInt offset = -currentNode;
      if (nodeLeft[currentNode] != -1) {
        if (nodeRight[currentNode] != -1)
          stack.push_back(nodeRight[currentNode]);
        currentNode = nodeLeft[currentNode];
      } else if (nodeRight[currentNode] != -1) {
        currentNode = nodeRight[currentNode];
      } else {
        currentNode = stack.back();
        stack.pop_back();
      }
      offset += currentNode;
      pos_.index_ += offset;
      pos_.value_ += offset;
      return *this;
    }